

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  bool bVar1;
  Result RVar2;
  long lVar3;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    global->mutable_ = true;
    RVar2 = ParseValueType(this,&global->type);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"i32","");
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"i64","");
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"f32","");
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"f64","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_c8,&local_48);
    lVar3 = 0;
    RVar2 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    do {
      if (local_58 + lVar3 != *(undefined1 **)((long)local_68 + lVar3)) {
        operator_delete(*(undefined1 **)((long)local_68 + lVar3));
      }
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x80);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Rpar);
  }
  else {
    RVar2 = ParseValueType(this,&global->type);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    CHECK_RESULT(ParseValueType(&global->type));
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    CHECK_RESULT(ParseValueType(&global->type));
  }

  return Result::Ok;
}